

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cpp
# Opt level: O2

int __thiscall piksel::Font::_load(Font *this,uchar *fontBuffer)

{
  Point2 p0;
  Point2 p0_00;
  Point2 p0_01;
  Point2 p1;
  Point2 p1_00;
  Point2 p1_01;
  Point2 p2;
  Point2 p2_00;
  Point2 p3;
  stbtt_vertex *psVar1;
  int iVar2;
  uint uVar3;
  stbtt_fontinfo *psVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  Letter letter;
  EdgeHolder edge;
  Contour contour;
  Vector2 local_a8;
  Shape local_98;
  double dStack_90;
  Shape local_88;
  double dStack_80;
  Shape local_78;
  int iStack_70;
  int iStack_6c;
  vector<piksel::Letter,_std::allocator<piksel::Letter>_> *local_68;
  Font *local_60;
  stbtt_vertex *vertices;
  Shape shape;
  
  psVar4 = (stbtt_fontinfo *)operator_new(0xa0);
  iVar6 = 0;
  memset(psVar4,0,0xa0);
  this->info = psVar4;
  iVar2 = stbtt_InitFont(psVar4,fontBuffer,0);
  if (iVar2 == 0) {
    fputs("Failed to load font",_stderr);
  }
  else {
    stbtt_GetFontVMetrics(this->info,&this->ascent,&this->descent,&this->lineGap);
    stbtt_GetFontBoundingBox(this->info,&this->x0,&this->y1,&this->x1,&this->y1);
    local_68 = &this->letters;
    local_60 = this;
    for (iVar6 = 0x20; iVar6 != 0x7f; iVar6 = iVar6 + 1) {
      psVar4 = this->info;
      iVar2 = stbtt_FindGlyphIndex(psVar4,iVar6);
      uVar3 = stbtt_GetGlyphShape(psVar4,iVar2,&vertices);
      msdfgen::Shape::Shape(&shape);
      contour.edges.super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      contour.edges.super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      contour.edges.super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      msdfgen::EdgeHolder::EdgeHolder(&edge);
      lVar7 = 0;
      do {
        msdfgen::Vector2::Vector2((Vector2 *)((long)&local_a8.x + lVar7),0.0);
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x40);
      uVar5 = 0;
      if (0 < (int)uVar3) {
        uVar5 = (ulong)uVar3;
      }
      for (lVar7 = 0; psVar1 = vertices, uVar5 * 0xe - lVar7 != 0; lVar7 = lVar7 + 0xe) {
        switch((&vertices->type)[lVar7]) {
        case '\x01':
          if (lVar7 != 0) {
            msdfgen::Shape::addContour(&shape,&contour);
            letter.shape.xoff = 0;
            letter.shape.yoff = 0;
            letter.advanceWidth = 0;
            letter.leftSideBearing = 0;
            letter.x0 = 0;
            letter.y0 = 0;
            std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::_M_move_assign
                      (&contour.edges,&letter);
            std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::~vector
                      ((vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_> *)&letter)
            ;
          }
          break;
        case '\x02':
          msdfgen::Vector2::Vector2
                    ((Vector2 *)&letter,(double)(int)*(short *)((long)&vertices->x + lVar7),
                     (double)(int)*(short *)((long)&vertices->y + lVar7));
          local_98 = letter.shape;
          dStack_90 = (double)letter._8_8_;
          p0_01.y = local_a8.y;
          p0_01.x = local_a8.x;
          p1_01.y = (double)letter._8_8_;
          p1_01.x = (double)letter.shape;
          msdfgen::EdgeHolder::EdgeHolder((EdgeHolder *)&letter,p0_01,p1_01,WHITE);
          msdfgen::Contour::addEdge(&contour,(EdgeHolder *)&letter);
          goto LAB_0014b1dc;
        case '\x03':
          msdfgen::Vector2::Vector2
                    ((Vector2 *)&letter,(double)(int)*(short *)((long)&vertices->cx + lVar7),
                     (double)(int)*(short *)((long)&vertices->cy + lVar7));
          local_98 = letter.shape;
          dStack_90 = (double)letter._8_8_;
          msdfgen::Vector2::Vector2
                    ((Vector2 *)&letter,(double)(int)*(short *)((long)&psVar1->x + lVar7),
                     (double)(int)*(short *)((long)&psVar1->y + lVar7));
          local_88 = letter.shape;
          dStack_80 = (double)letter._8_8_;
          p0.y = local_a8.y;
          p0.x = local_a8.x;
          p1.y = dStack_90;
          p1.x = (double)local_98;
          p2.y = (double)letter._8_8_;
          p2.x = (double)letter.shape;
          msdfgen::EdgeHolder::EdgeHolder((EdgeHolder *)&letter,p0,p1,p2,WHITE);
          msdfgen::Contour::addEdge(&contour,(EdgeHolder *)&letter);
LAB_0014b1dc:
          msdfgen::EdgeHolder::~EdgeHolder((EdgeHolder *)&letter);
          break;
        case '\x04':
          msdfgen::Vector2::Vector2
                    ((Vector2 *)&letter,(double)(int)*(short *)((long)&vertices->cx + lVar7),
                     (double)(int)*(short *)((long)&vertices->cy + lVar7));
          local_98 = letter.shape;
          dStack_90 = (double)letter._8_8_;
          msdfgen::Vector2::Vector2
                    ((Vector2 *)&letter,(double)(int)*(short *)((long)&psVar1->cx1 + lVar7),
                     (double)(int)*(short *)((long)&psVar1->cy1 + lVar7));
          local_88 = letter.shape;
          dStack_80 = (double)letter._8_8_;
          msdfgen::Vector2::Vector2
                    ((Vector2 *)&letter,(double)(int)*(short *)((long)&psVar1->x + lVar7),
                     (double)(int)*(short *)((long)&psVar1->y + lVar7));
          local_78 = letter.shape;
          iStack_70 = letter.advanceWidth;
          iStack_6c = letter.leftSideBearing;
          p0_00.y = local_a8.y;
          p0_00.x = local_a8.x;
          p1_00.y = dStack_90;
          p1_00.x = (double)local_98;
          p2_00.y = dStack_80;
          p2_00.x = (double)local_88;
          p3.y = (double)letter._8_8_;
          p3.x = (double)letter.shape;
          msdfgen::EdgeHolder::EdgeHolder((EdgeHolder *)&letter,p0_00,p1_00,p2_00,p3,WHITE);
          msdfgen::EdgeHolder::operator=(&edge,(EdgeHolder *)&letter);
          msdfgen::EdgeHolder::~EdgeHolder((EdgeHolder *)&letter);
          msdfgen::Contour::addEdge(&contour,&edge);
        }
        msdfgen::Vector2::Vector2
                  ((Vector2 *)&letter,(double)(int)*(short *)((long)&psVar1->x + lVar7),
                   (double)(int)*(short *)((long)&psVar1->y + lVar7));
        local_a8.x = (double)letter.shape;
        local_a8.y = (double)letter._8_8_;
      }
      if (0 < (int)uVar3) {
        msdfgen::Shape::addContour(&shape,&contour);
      }
      registerShape(&shape,&letter.shape);
      this = local_60;
      psVar4 = local_60->info;
      iVar2 = stbtt_FindGlyphIndex(psVar4,iVar6);
      stbtt_GetGlyphHMetrics(psVar4,iVar2,&letter.advanceWidth,&letter.leftSideBearing);
      psVar4 = this->info;
      iVar2 = stbtt_FindGlyphIndex(psVar4,iVar6);
      stbtt_GetGlyphBox(psVar4,iVar2,&letter.x0,&letter.y0,&letter.x1,&letter.y1);
      std::vector<piksel::Letter,_std::allocator<piksel::Letter>_>::push_back(local_68,&letter);
      msdfgen::EdgeHolder::~EdgeHolder(&edge);
      std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::~vector
                (&contour.edges);
      std::vector<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>::~vector(&shape.contours);
    }
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int Font::_load(const unsigned char* fontBuffer) {
    info = new stbtt_fontinfo();
    if (!stbtt_InitFont(info, fontBuffer, 0)) {
        fputs("Failed to load font", stderr);
        return 0;
    }
    stbtt_GetFontVMetrics(info, &ascent, &descent, &lineGap);
    stbtt_GetFontBoundingBox(info, &x0, &y1, &x1, &y1);

    for (char ch = ' '; ch <= '~'; ch++) {
        stbtt_vertex* vertices;
        int num_verts = stbtt_GetGlyphShape(info, stbtt_FindGlyphIndex(info, ch), &vertices);
        
        msdfgen::Shape shape;
        msdfgen::Contour contour;
        msdfgen::EdgeHolder edge;
        msdfgen::Point2 p[4];
        for (int i = 0; i < num_verts; i++) {
            stbtt_vertex* vertex = vertices + i;
            switch(vertex->type) {
                case STBTT_vmove:
                    if (i > 0) {
                        shape.addContour(contour);
                        contour = msdfgen::Contour();
                    }
                    break;
                case STBTT_vline:
                    p[1] = msdfgen::Point2((double) vertex->x, (double) vertex->y);
                    contour.addEdge(msdfgen::EdgeHolder(p[0], p[1]));
                    break;
                case STBTT_vcurve:
                    p[1] = msdfgen::Point2((double) vertex->cx, (double) vertex->cy);
                    p[2] = msdfgen::Point2((double) vertex->x, (double) vertex->y);
                    contour.addEdge(msdfgen::EdgeHolder(p[0], p[1], p[2]));
                    break;
                case STBTT_vcubic:
                    p[1] = msdfgen::Point2((double) vertex->cx, (double) vertex->cy);
                    p[2] = msdfgen::Point2((double) vertex->cx1, (double) vertex->cy1);
                    p[3] = msdfgen::Point2((double) vertex->x, (double) vertex->y);
                    edge = msdfgen::EdgeHolder(p[0], p[1], p[2], p[3]);
                    contour.addEdge(edge);
                    break;
            }
            p[0] = msdfgen::Point2((double) vertex->x, (double) vertex->y);
        }
        if (num_verts > 0) {
            shape.addContour(contour);
        }

        Letter letter;
        registerShape(shape, letter.shape);

        stbtt_GetGlyphHMetrics(info, stbtt_FindGlyphIndex(info, ch), &letter.advanceWidth, &letter.leftSideBearing);
        stbtt_GetGlyphBox(info, stbtt_FindGlyphIndex(info, ch), &letter.x0, &letter.y0, &letter.x1, &letter.y1);

        letters.push_back(letter);
    }

    return 1;
}